

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeFloatConstant(Builder *this,float f,bool specConstant)

{
  pointer *pppIVar1;
  iterator __position;
  iterator __position_00;
  Id typeId;
  Op OVar2;
  Id IVar3;
  undefined7 in_register_00000031;
  Instruction *c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  _Head_base<0UL,_spv::Instruction_*,_false> local_28;
  
  typeId = makeFloatType(this,0x20);
  OVar2 = OpSpecConstant;
  if (((int)CONCAT71(in_register_00000031,specConstant) != 0) ||
     (IVar3 = findScalarConstant(this,OpTypeFloat,OpConstant,typeId,(uint)f), OVar2 = OpConstant,
     IVar3 == 0)) {
    local_30._M_head_impl = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar3 = this->uniqueId + 1;
    this->uniqueId = IVar3;
    (local_30._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    (local_30._M_head_impl)->resultId = IVar3;
    (local_30._M_head_impl)->typeId = typeId;
    (local_30._M_head_impl)->opCode = OVar2;
    ((local_30._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_30._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     &((local_30._M_head_impl)->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    local_28._M_head_impl._0_4_ = f;
    __position._M_current =
         ((local_30._M_head_impl)->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((local_30._M_head_impl)->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &(local_30._M_head_impl)->operands,__position,(uint *)&local_28);
    }
    else {
      *__position._M_current = (uint)f;
      ((local_30._M_head_impl)->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_28._M_head_impl = local_30._M_head_impl;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_28);
    if (local_28._M_head_impl != (Instruction *)0x0) {
      (*(local_28._M_head_impl)->_vptr_Instruction[1])();
    }
    __position_00._M_current =
         this->groupedConstants[0x16].
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        this->groupedConstants[0x16].
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>
                ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
                 (this->groupedConstants + 0x16),__position_00,&local_30._M_head_impl);
    }
    else {
      *__position_00._M_current = local_30._M_head_impl;
      pppIVar1 = &this->groupedConstants[0x16].
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    Module::mapInstruction(&this->module,local_30._M_head_impl);
    IVar3 = (local_30._M_head_impl)->resultId;
  }
  return IVar3;
}

Assistant:

Id Builder::makeFloatConstant(float f, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;
    Id typeId = makeFloatType(32);
    union { float fl; unsigned int ui; } u;
    u.fl = f;
    unsigned value = u.ui;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeFloat, opcode, typeId, value);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(value);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeFloat].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}